

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMeshFileLoader.cpp
# Opt level: O3

void chrono::fea::ChMeshFileLoader::BSTShellFromObjFile
               (shared_ptr<chrono::fea::ChMesh> *mesh,char *filename,
               shared_ptr<chrono::fea::ChMaterialShellKirchhoff> *my_material,double my_thickness,
               ChVector<double> *pos_transform,ChMatrix33<double> *rot_transform)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  ChMesh *pCVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var6;
  uint uVar7;
  pointer pCVar8;
  pointer pCVar9;
  mapped_type *pmVar10;
  ChElementShellBST *this;
  uint uVar11;
  long lVar12;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var13;
  ulong uVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  pair<int,_int> medge2;
  pair<int,_int> medge1;
  pair<int,_int> medge0;
  shared_ptr<chrono::fea::ChNodeFEAxyz> mnode;
  shared_ptr<chrono::fea::ChElementShellBST> melement;
  shared_ptr<chrono::fea::ChNodeFEAxyz> node4;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  shapenodes;
  shared_ptr<chrono::fea::ChNodeFEAxyz> node5;
  map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  winged_edges;
  shared_ptr<chrono::geometry::ChTriangleMeshConnected> mmesh;
  key_type local_220;
  key_type local_218;
  key_type local_210;
  value_type local_208;
  ChTriangleMeshConnected *local_1f0;
  ChElementShellBST *local_1e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1e0;
  element_type *local_1d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1d0;
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  local_1c8;
  element_type *local_1a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_1a0 [2];
  undefined1 local_190 [32];
  _Base_ptr local_170;
  size_t local_168;
  shared_ptr<chrono::fea::ChMesh> *local_160;
  undefined1 local_158 [24];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_140;
  shared_ptr<chrono::fea::ChMaterialShellKirchhoff> local_138;
  shared_ptr<chrono::fea::ChElementBase> local_128;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_118;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_108;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_f8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_e8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_d8;
  shared_ptr<chrono::fea::ChNodeFEAxyz> local_c8;
  shared_ptr<chrono::fea::ChMaterialShellKirchhoff> *local_b8;
  pointer local_b0;
  pointer local_a8;
  pointer local_a0;
  pointer local_98;
  pointer local_90;
  pointer local_88;
  pointer local_80;
  _Alloc_hider local_78;
  double local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  double local_58;
  double local_50;
  double local_48;
  ulong local_40;
  ulong local_38;
  
  local_160 = mesh;
  local_b8 = my_material;
  local_b0 = (pointer)my_thickness;
  std::__cxx11::string::string((string *)local_190,filename,(allocator *)&local_1c8);
  geometry::ChTriangleMeshConnected::CreateFromWavefrontFile
            ((ChTriangleMeshConnected *)local_158,(string *)local_190,false,false);
  if ((undefined1 *)local_190._0_8_ != local_190 + 0x10) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  local_190._24_8_ = local_190 + 8;
  local_190._8_4_ = _S_red;
  local_190._16_8_ = 0;
  local_168 = 0;
  local_1f0 = (ChTriangleMeshConnected *)local_158._0_8_;
  local_170 = (_Base_ptr)local_190._24_8_;
  geometry::ChTriangleMeshConnected::ComputeWingedEdges
            ((ChTriangleMeshConnected *)local_158._0_8_,
             (map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
              *)local_190,true);
  local_1c8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  pCVar8 = (((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
            (local_158._0_8_ + 8))->
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>)
           ._M_impl.super__Vector_impl_data._M_start;
  if (*(pointer *)(local_158._0_8_ + 0x10) != pCVar8) {
    lVar12 = 0x10;
    uVar14 = 0;
    do {
      local_58 = *(double *)((long)pCVar8->m_data + lVar12 + -8);
      local_40 = *(ulong *)((long)pCVar8->m_data + lVar12);
      local_38 = *(ulong *)((long)pCVar8->m_data + lVar12 + -0x10);
      local_48 = (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [0];
      local_68._8_8_ =
           (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
      local_50 = (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [2];
      local_70 = (rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                 super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array
                 [3];
      local_80 = (pointer)(rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[4];
      local_78._M_p =
           (pointer)(rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.
                    array[5];
      local_90 = (pointer)(rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[6];
      local_a8 = (pointer)(rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[7];
      local_98 = (pointer)(rot_transform->super_Matrix<double,_3,_3,_1,_3,_3>).
                          super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.
                          m_data.array[8];
      local_68._M_allocated_capacity = (size_type)pos_transform->m_data[0];
      local_88 = (pointer)pos_transform->m_data[1];
      local_a0 = (pointer)pos_transform->m_data[2];
      local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChNodeFEAxyz,std::allocator<chrono::fea::ChNodeFEAxyz>>
                (&local_208.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,(ChNodeFEAxyz **)&local_208,
                 (allocator<chrono::fea::ChNodeFEAxyz> *)&local_1d8);
      auVar22._8_8_ = 0;
      auVar22._0_8_ = local_38;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_90;
      auVar23._8_8_ = 0;
      auVar23._0_8_ = local_40;
      auVar24._8_8_ = 0;
      auVar24._0_8_ = local_70;
      auVar25._8_8_ = 0;
      auVar25._0_8_ = local_48;
      auVar15._8_8_ = 0;
      auVar15._0_8_ = local_58 * (double)local_a8;
      auVar15 = vfmadd213sd_fma(auVar17,auVar22,auVar15);
      auVar16._8_8_ = 0;
      auVar16._0_8_ = local_98;
      auVar15 = vfmadd213sd_fma(auVar16,auVar23,auVar15);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = local_58 * (double)local_80;
      auVar16 = vfmadd213sd_fma(auVar24,auVar22,auVar18);
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_78._M_p;
      auVar20._8_8_ = 0;
      auVar20._0_8_ = local_58 * (double)local_68._8_8_;
      auVar17 = vfmadd213sd_fma(auVar25,auVar22,auVar20);
      auVar21._8_8_ = 0;
      auVar21._0_8_ = local_50;
      auVar16 = vfmadd213sd_fma(auVar19,auVar23,auVar16);
      auVar17 = vfmadd213sd_fma(auVar21,auVar23,auVar17);
      *(double *)
       &((local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         )->super_ChNodeFEAbase).field_0x20 = auVar17._0_8_ + (double)local_68._M_allocated_capacity
      ;
      *(double *)
       &(local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->field_0x28 = auVar16._0_8_ + (double)local_88;
      *(double *)
       &(local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
        ->field_0x30 = auVar15._0_8_ + (double)local_a0;
      pCVar5 = (local_160->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_158._16_8_ =
           local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_140 = local_208.
                  super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
      if (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddNode(pCVar5,(shared_ptr<chrono::fea::ChNodeFEAbase> *)(local_158 + 0x10));
      if (local_140 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_140);
      }
      std::
      vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
      ::push_back(&local_1c8,&local_208);
      if (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar14 = uVar14 + 1;
      lVar12 = lVar12 + 0x18;
      pCVar8 = (((vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_> *)
                (local_158._0_8_ + 8))->
               super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)(((long)*(pointer *)(local_158._0_8_ + 0x10) - (long)pCVar8 >> 3) *
                             -0x5555555555555555));
  }
  pCVar9 = (local_1f0->m_face_v_indices).
           super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((local_1f0->m_face_v_indices).
      super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar9) {
    uVar14 = 0;
    do {
      uVar1 = pCVar9[uVar14].m_data[0];
      uVar2 = pCVar9[uVar14].m_data[1];
      uVar3 = pCVar9[uVar14].m_data[2];
      local_210.second = uVar3;
      local_210.first = uVar2;
      if ((int)uVar3 < (int)uVar2) {
        local_210.second = uVar2;
        local_210.first = uVar3;
      }
      local_218.first = uVar3;
      local_218.second = uVar1;
      if ((int)uVar1 < (int)uVar3) {
        local_218.first = uVar1;
        local_218.second = uVar3;
      }
      local_220.first = uVar1;
      local_220.second = uVar2;
      if (local_210.second < local_210.first) {
        local_220.first = uVar2;
        local_220.second = uVar1;
      }
      local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1d8 = (element_type *)0x0;
      _Stack_1d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a8 = (element_type *)0x0;
      a_Stack_1a0[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pmVar10 = std::
                map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::operator[]((map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                              *)local_190,&local_210);
      if (uVar14 == (long)pmVar10->second) {
        pmVar10 = std::
                  map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                *)local_190,&local_210);
      }
      else {
        pmVar10 = std::
                  map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                *)local_190,&local_210);
        pmVar10 = (mapped_type *)&pmVar10->second;
      }
      uVar11 = 0xffffffff;
      lVar12 = 0;
      do {
        uVar4 = (local_1f0->m_face_v_indices).
                super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[pmVar10->first].m_data[lVar12];
        uVar7 = uVar4;
        if (uVar4 == local_210.second) {
          uVar7 = uVar11;
        }
        if (uVar4 == local_210.first) {
          uVar7 = uVar11;
        }
        uVar11 = uVar7;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      if (uVar11 != 0xffffffff) {
        p_Var13 = &local_1c8.
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)uVar11].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)(p_Var13 + -1))
             ->_M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&local_208.
                    super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,p_Var13);
      }
      pmVar10 = std::
                map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::operator[]((map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                              *)local_190,&local_218);
      if (uVar14 == (long)pmVar10->second) {
        pmVar10 = std::
                  map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                *)local_190,&local_218);
      }
      else {
        pmVar10 = std::
                  map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                *)local_190,&local_218);
        pmVar10 = (mapped_type *)&pmVar10->second;
      }
      uVar11 = 0xffffffff;
      lVar12 = 0;
      do {
        uVar4 = (local_1f0->m_face_v_indices).
                super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[pmVar10->first].m_data[lVar12];
        uVar7 = uVar4;
        if (uVar4 == local_218.second) {
          uVar7 = uVar11;
        }
        if (uVar4 == local_218.first) {
          uVar7 = uVar11;
        }
        uVar11 = uVar7;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      if (uVar11 != 0xffffffff) {
        p_Var13 = &local_1c8.
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)uVar11].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_1d8 = ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                    (p_Var13 + -1))->_M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_1d0,p_Var13);
      }
      pmVar10 = std::
                map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                ::operator[]((map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                              *)local_190,&local_220);
      if (uVar14 == (long)pmVar10->second) {
        pmVar10 = std::
                  map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                *)local_190,&local_220);
      }
      else {
        pmVar10 = std::
                  map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                  ::operator[]((map<std::pair<int,_int>,_std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
                                *)local_190,&local_220);
        pmVar10 = (mapped_type *)&pmVar10->second;
      }
      p_Var13 = (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(ulong)(uint)local_220.second;
      uVar11 = 0xffffffff;
      lVar12 = 0;
      do {
        uVar4 = (local_1f0->m_face_v_indices).
                super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
                _M_impl.super__Vector_impl_data._M_start[pmVar10->first].m_data[lVar12];
        uVar7 = uVar4;
        if (uVar4 == local_220.second) {
          uVar7 = uVar11;
        }
        if (uVar4 == local_220.first) {
          uVar7 = uVar11;
        }
        uVar11 = uVar7;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 3);
      if (uVar11 != 0xffffffff) {
        p_Var13 = &local_1c8.
                   super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[(int)uVar11].
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount;
        local_1a8 = ((__shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2> *)
                    (p_Var13 + -1))->_M_ptr;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(a_Stack_1a0,p_Var13);
      }
      this = (ChElementShellBST *)
             ChElementShellBST::operator_new((ChElementShellBST *)0x2a0,(size_t)p_Var13);
      ChElementShellBST::ChElementShellBST(this);
      local_1e8 = this;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<chrono::fea::ChElementShellBST*>(&_Stack_1e0,this);
      local_c8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_1c8.
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_c8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = local_1c8.
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      p_Var6 = local_1c8.
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar1].
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      local_d8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_1c8.
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_d8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = local_1c8.
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      p_Var6 = local_1c8.
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar2].
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_1c8.
           super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
           ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
           super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = local_1c8.
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      p_Var6 = local_1c8.
               super__Vector_base<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
               ._M_impl.super__Vector_impl_data._M_start[(int)uVar3].
               super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
               ._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      if (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_1d8;
      local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Stack_1d0._M_pi;
      if (_Stack_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_1d0._M_pi)->_M_use_count = (_Stack_1d0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_1d0._M_pi)->_M_use_count = (_Stack_1d0._M_pi)->_M_use_count + 1;
        }
      }
      local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           local_1a8;
      local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = a_Stack_1a0[0]._M_pi;
      if (a_Stack_1a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (a_Stack_1a0[0]._M_pi)->_M_use_count = (a_Stack_1a0[0]._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (a_Stack_1a0[0]._M_pi)->_M_use_count = (a_Stack_1a0[0]._M_pi)->_M_use_count + 1;
        }
      }
      ChElementShellBST::SetNodes
                (local_1e8,&local_c8,&local_d8,&local_e8,&local_f8,&local_108,&local_118);
      if (local_118.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_118.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_108.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_108.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_f8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_f8.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_e8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_d8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_d8.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      if (local_c8.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_c8.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      pCVar5 = (local_160->super___shared_ptr<chrono::fea::ChMesh,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr;
      local_128.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)local_1e8;
      local_128.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = _Stack_1e0._M_pi;
      if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (_Stack_1e0._M_pi)->_M_use_count = (_Stack_1e0._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (_Stack_1e0._M_pi)->_M_use_count = (_Stack_1e0._M_pi)->_M_use_count + 1;
        }
      }
      ChMesh::AddElement(pCVar5,&local_128);
      if (local_128.super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_128.
                   super___shared_ptr<chrono::fea::ChElementBase,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      local_138.
      super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (local_b8->
           super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
      local_138.
      super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi =
           (local_b8->
           super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
      p_Var6 = (local_b8->
               super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
      if (p_Var6 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var6->_M_use_count = p_Var6->_M_use_count + 1;
        }
      }
      ChElementShellBST::AddLayer(local_1e8,(double)local_b0,0.0,&local_138);
      if (local_138.
          super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_138.
                   super___shared_ptr<chrono::fea::ChMaterialShellKirchhoff,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (_Stack_1e0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1e0._M_pi);
      }
      if (a_Stack_1a0[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_1a0[0]._M_pi);
      }
      if (_Stack_1d0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1d0._M_pi);
      }
      if (local_208.super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_208.
                   super___shared_ptr<chrono::fea::ChNodeFEAxyz,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
      uVar14 = uVar14 + 1;
      pCVar9 = (local_1f0->m_face_v_indices).
               super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (uVar14 < (ulong)(((long)(local_1f0->m_face_v_indices).
                                     super__Vector_base<chrono::ChVector<int>,_std::allocator<chrono::ChVector<int>_>_>
                                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar9 >> 2)
                             * -0x5555555555555555));
  }
  std::
  vector<std::shared_ptr<chrono::fea::ChNodeFEAxyz>,_std::allocator<std::shared_ptr<chrono::fea::ChNodeFEAxyz>_>_>
  ::~vector(&local_1c8);
  std::
  _Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::pair<int,_int>,_std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>,_std::_Select1st<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_std::pair<int,_int>_>_>_>
               *)local_190);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_158._8_8_);
  }
  return;
}

Assistant:

void ChMeshFileLoader::BSTShellFromObjFile(
    std::shared_ptr<ChMesh> mesh,                           // destination mesh
    const char* filename,                                   // .obj mesh complete filename
    std::shared_ptr<ChMaterialShellKirchhoff> my_material,  // material to be given to the shell elements
    double my_thickness,                                    // thickness to be given to shell elements
    ChVector<> pos_transform,                               // optional displacement of imported mesh
    ChMatrix33<> rot_transform                              // optional rotation/scaling of imported mesh
) {
    auto mmesh = geometry::ChTriangleMeshConnected::CreateFromWavefrontFile(std::string(filename), false, false);
    const auto& v_indices = mmesh->m_face_v_indices;

    std::map<std::pair<int, int>, std::pair<int, int>> winged_edges;
    mmesh->ComputeWingedEdges(winged_edges);

    std::vector<std::shared_ptr<ChNodeFEAxyz>> shapenodes;
    for (size_t i = 0; i < mmesh->m_vertices.size(); i++) {
        ChVector<double> pos = mmesh->m_vertices[i];
        pos = rot_transform * pos;
        pos += pos_transform;
        auto mnode = chrono_types::make_shared<ChNodeFEAxyz>();
        mnode->SetPos(pos);
        mesh->AddNode(mnode);
        shapenodes.push_back(mnode);  // for future reference when adding faces
    }

    for (size_t j = 0; j < v_indices.size(); j++) {
        int i0 = v_indices[j][0];
        int i1 = v_indices[j][1];
        int i2 = v_indices[j][2];
        // GetLog() << "nodes 012 ids= " << i0 << " " << i1 << " " << i2 << " " << "\n";

        std::pair<int, int> medge0(i1, i2);
        std::pair<int, int> medge1(i2, i0);
        std::pair<int, int> medge2(i0, i1);
        if (medge0.first > medge0.second)
            medge0 = std::pair<int, int>(medge0.second, medge0.first);
        if (medge1.first > medge1.second)
            medge1 = std::pair<int, int>(medge1.second, medge1.first);
        if (medge0.first > medge0.second)
            medge2 = std::pair<int, int>(medge2.second, medge2.first);
        std::shared_ptr<ChNodeFEAxyz> node3 = nullptr;
        std::shared_ptr<ChNodeFEAxyz> node4 = nullptr;
        std::shared_ptr<ChNodeFEAxyz> node5 = nullptr;
        int itri = -1;
        int ivert = -1;
        if (winged_edges[medge0].second == j)
            itri = winged_edges[medge0].first;
        else
            itri = winged_edges[medge0].second;
        for (int vi = 0; vi < 3; ++vi) {
            if (v_indices[itri][vi] != medge0.first && v_indices[itri][vi] != medge0.second)
                ivert = v_indices[itri][vi];
        }
        if (ivert != -1)
            node3 = shapenodes[ivert];

        itri = -1;
        ivert = -1;
        if (winged_edges[medge1].second == j)
            itri = winged_edges[medge1].first;
        else
            itri = winged_edges[medge1].second;
        for (int vi = 0; vi < 3; ++vi) {
            if (v_indices[itri][vi] != medge1.first && v_indices[itri][vi] != medge1.second)
                ivert = v_indices[itri][vi];
        }
        if (ivert != -1)
            node4 = shapenodes[ivert];

        itri = -1;
        ivert = -1;
        if (winged_edges[medge2].second == j)
            itri = winged_edges[medge2].first;
        else
            itri = winged_edges[medge2].second;
        for (int vi = 0; vi < 3; ++vi) {
            if (v_indices[itri][vi] != medge2.first && v_indices[itri][vi] != medge2.second)
                ivert = v_indices[itri][vi];
        }
        if (ivert != -1)
            node5 = shapenodes[ivert];

        auto melement = chrono_types::make_shared<ChElementShellBST>();
        melement->SetNodes(shapenodes[i0], shapenodes[i1], shapenodes[i2], node3, node4, node5);
        mesh->AddElement(melement);
        melement->AddLayer(my_thickness, 0, my_material);
    }
}